

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O1

vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
* OnDiskDataset::get_compatible_datasets
            (vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
             *__return_storage_ptr__,
            vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pOVar2;
  iterator __position;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  *this;
  pointer ppOVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *this_00;
  _Rb_tree_node_base *p_Var7;
  size_type *psVar8;
  pointer pOVar9;
  OnDiskDataset *ds;
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ds_class;
  map<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
  partial;
  OnDiskDataset *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  *local_c8;
  pointer local_c0;
  pointer local_b8;
  string local_b0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_90 [8];
  undefined4 local_88 [2];
  undefined8 local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined8 local_68;
  _Rb_tree<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>,_std::_Select1st<std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppOVar4 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_c0 = (datasets->
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_c8 = __return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppOVar4 != local_c0) {
    paVar1 = &local_e8.field_2;
    do {
      local_f0 = *ppOVar4;
      local_88[0] = 0;
      local_80 = 0;
      local_78 = local_88;
      local_68 = 0;
      psVar3 = &local_f0->taints;
      local_70 = local_78;
      local_b8 = ppOVar4;
      for (p_Var5 = (local_f0->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        std::operator+(&local_e8,"taint:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var5 + 1));
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>(local_90,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      pOVar2 = (local_f0->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pOVar9 = (local_f0->indices).
                    super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
                    super__Vector_impl_data._M_start; pOVar9 != pOVar2; pOVar9 = pOVar9 + 1) {
        get_index_type_name_abi_cxx11_(&local_b0,pOVar9->ntype);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1b39c1);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_e8.field_2._M_allocated_capacity = *psVar8;
          local_e8.field_2._8_8_ = plVar6[3];
          local_e8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar8;
          local_e8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_e8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>(local_90,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      this_00 = (vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                std::
                map<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
                ::operator[]((map<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
                              *)&local_60,(key_type *)local_90);
      __position._M_current = *(OnDiskDataset ***)(this_00 + 8);
      if (__position._M_current == *(OnDiskDataset ***)(this_00 + 0x10)) {
        std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
        _M_realloc_insert<OnDiskDataset_const*const&>(this_00,__position,&local_f0);
      }
      else {
        *__position._M_current = local_f0;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_90);
      ppOVar4 = local_b8 + 1;
    } while (ppOVar4 != local_c0);
  }
  this = local_c8;
  (local_c8->
  super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_c8->
  super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_c8->
  super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  ::reserve(local_c8,local_60._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    std::
    vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
    ::push_back(this,(value_type *)&p_Var7[2]._M_left);
  }
  std::
  _Rb_tree<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>,_std::_Select1st<std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>,_std::less<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return this;
}

Assistant:

std::vector<std::vector<const OnDiskDataset *>>
OnDiskDataset::get_compatible_datasets(
    const std::vector<const OnDiskDataset *> &datasets) {
    std::map<std::set<std::string>, std::vector<const OnDiskDataset *>> partial;
    for (auto ds : datasets) {
        std::set<std::string> ds_class;
        for (const auto &taint : ds->get_taints()) {
            ds_class.insert("taint:" + taint);
        }
        for (const auto &index : ds->get_indexes()) {
            ds_class.insert("type:" + get_index_type_name(index.index_type()));
        }
        partial[ds_class].push_back(ds);
    }

    std::vector<std::vector<const OnDiskDataset *>> result;
    result.reserve(partial.size());
    for (const auto &kv : partial) {
        result.push_back(kv.second);
    }

    return result;
}